

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

GLuint __thiscall
Outputs::Display::OpenGL::Shader::compile_shader(Shader *this,string *source,GLenum type)

{
  uint __line;
  GLuint GVar1;
  int iVar2;
  uint *puVar3;
  ostream *poVar4;
  char *pcVar5;
  GLint logLength;
  GLint isCompiled;
  LogLine local_48;
  vector<char,_std::allocator<char>_> log;
  char *c_str;
  
  GVar1 = glCreateShader(type);
  c_str = (source->_M_dataplus)._M_p;
  glShaderSource(GVar1,1,&c_str,0);
  iVar2 = glGetError();
  if (iVar2 != 0) {
    switch(iVar2) {
    case 0x500:
      pcVar5 = "GL_INVALID_ENUM";
      break;
    case 0x501:
      pcVar5 = "GL_INVALID_VALUE";
      break;
    case 0x502:
      pcVar5 = "GL_INVALID_OPERATION";
      break;
    default:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      goto LAB_00376fa2;
    case 0x505:
      pcVar5 = "GL_OUT_OF_MEMORY";
      break;
    case 0x506:
      pcVar5 = "GL_INVALID_FRAMEBUFFER_OPERATION";
    }
    std::operator<<((ostream *)&std::cerr,pcVar5);
LAB_00376fa2:
    poVar4 = std::operator<<((ostream *)&std::cerr," at line ");
    __line = 0x18;
    goto LAB_0037706e;
  }
  glCompileShader(GVar1);
  iVar2 = glGetError();
  if (iVar2 != 0) {
    switch(iVar2) {
    case 0x500:
      pcVar5 = "GL_INVALID_ENUM";
      break;
    case 0x501:
      pcVar5 = "GL_INVALID_VALUE";
      break;
    case 0x502:
      pcVar5 = "GL_INVALID_OPERATION";
      break;
    default:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      goto LAB_00376fff;
    case 0x505:
      pcVar5 = "GL_OUT_OF_MEMORY";
      break;
    case 0x506:
      pcVar5 = "GL_INVALID_FRAMEBUFFER_OPERATION";
    }
    std::operator<<((ostream *)&std::cerr,pcVar5);
LAB_00376fff:
    poVar4 = std::operator<<((ostream *)&std::cerr," at line ");
    __line = 0x19;
    goto LAB_0037706e;
  }
  isCompiled = 0;
  glGetShaderiv(GVar1,0x8b81);
  iVar2 = glGetError();
  if (iVar2 != 0) {
    switch(iVar2) {
    case 0x500:
      pcVar5 = "GL_INVALID_ENUM";
      break;
    case 0x501:
      pcVar5 = "GL_INVALID_VALUE";
      break;
    case 0x502:
      pcVar5 = "GL_INVALID_OPERATION";
      break;
    default:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      goto LAB_00377059;
    case 0x505:
      pcVar5 = "GL_OUT_OF_MEMORY";
      break;
    case 0x506:
      pcVar5 = "GL_INVALID_FRAMEBUFFER_OPERATION";
    }
    std::operator<<((ostream *)&std::cerr,pcVar5);
LAB_00377059:
    poVar4 = std::operator<<((ostream *)&std::cerr," at line ");
    __line = 0x1d;
    goto LAB_0037706e;
  }
  if (isCompiled != 0) {
    return GVar1;
  }
  glGetShaderiv(GVar1,0x8b84,&logLength);
  iVar2 = glGetError();
  switch(iVar2) {
  case 0x500:
    pcVar5 = "GL_INVALID_ENUM";
    break;
  case 0x501:
    pcVar5 = "GL_INVALID_VALUE";
    break;
  case 0x502:
    pcVar5 = "GL_INVALID_OPERATION";
    break;
  case 0x503:
  case 0x504:
switchD_003770f1_caseD_503:
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    goto LAB_0037723c;
  case 0x505:
    pcVar5 = "GL_OUT_OF_MEMORY";
    break;
  case 0x506:
    pcVar5 = "GL_INVALID_FRAMEBUFFER_OPERATION";
    break;
  default:
    if (iVar2 != 0) goto switchD_003770f1_caseD_503;
    if ((long)logLength < 1) {
LAB_0037729a:
      puVar3 = (uint *)__cxa_allocate_exception(4);
      *puVar3 = (uint)(type != 0x8b31);
      __cxa_throw(puVar3,&{unnamed_type#1}::typeinfo,0);
    }
    std::vector<char,_std::allocator<char>_>::vector
              (&log,(long)logLength,(allocator_type *)&local_48);
    glGetShaderInfoLog(GVar1,logLength,&logLength,
                       log.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    iVar2 = glGetError();
    switch(iVar2) {
    case 0x500:
      pcVar5 = "GL_INVALID_ENUM";
      break;
    case 0x501:
      pcVar5 = "GL_INVALID_VALUE";
      break;
    case 0x502:
      pcVar5 = "GL_INVALID_OPERATION";
      break;
    case 0x503:
    case 0x504:
      goto switchD_003771cb_caseD_503;
    case 0x505:
      pcVar5 = "GL_OUT_OF_MEMORY";
      break;
    case 0x506:
      pcVar5 = "GL_INVALID_FRAMEBUFFER_OPERATION";
      break;
    default:
      if (iVar2 == 0) {
        Log::Logger<(Log::Source)24>::error((Logger<(Log::Source)24> *)&local_48);
        Log::Logger<(Log::Source)24>::LogLine::append
                  (&local_48,"Compile log: %s",
                   log.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        Log::Logger<(Log::Source)24>::LogLine::~LogLine(&local_48);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&log.super__Vector_base<char,_std::allocator<char>_>);
        goto LAB_0037729a;
      }
      goto switchD_003771cb_caseD_503;
    }
    std::operator<<((ostream *)&std::cerr,pcVar5);
LAB_0037730e:
    poVar4 = std::operator<<((ostream *)&std::cerr," at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x24);
    poVar4 = std::operator<<(poVar4," in ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                  ,0x24,
                  "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
                 );
  }
  std::operator<<((ostream *)&std::cerr,pcVar5);
LAB_0037723c:
  poVar4 = std::operator<<((ostream *)&std::cerr," at line ");
  __line = 0x20;
LAB_0037706e:
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,__line);
  poVar4 = std::operator<<(poVar4," in ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/OpenGL/Primitives/Shader.cpp"
                ,__line,
                "GLuint Outputs::Display::OpenGL::Shader::compile_shader(const std::string &, GLenum)"
               );
switchD_003771cb_caseD_503:
  poVar4 = std::operator<<((ostream *)&std::cerr,"Error ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  goto LAB_0037730e;
}

Assistant:

GLuint Shader::compile_shader(const std::string &source, GLenum type) {
	GLuint shader = glCreateShader(type);
	const char *c_str = source.c_str();
	test_gl(glShaderSource, shader, 1, &c_str, NULL);
	test_gl(glCompileShader, shader);

	if constexpr (logger.enabled) {
		GLint isCompiled = 0;
		test_gl(glGetShaderiv, shader, GL_COMPILE_STATUS, &isCompiled);
		if(isCompiled == GL_FALSE) {
			GLint logLength;
			test_gl(glGetShaderiv, shader, GL_INFO_LOG_LENGTH, &logLength);
			if(logLength > 0) {
				const auto length = std::vector<GLchar>::size_type(logLength);
				std::vector<GLchar> log(length);
				test_gl(glGetShaderInfoLog, shader, logLength, &logLength, log.data());
				logger.error().append("Compile log: %s", log.data());
			}

			throw (type == GL_VERTEX_SHADER) ? VertexShaderCompilationError : FragmentShaderCompilationError;
		}
	}

	return shader;
}